

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t uloc_acceptLanguage_63
                  (char *result,int32_t resultAvailable,UAcceptResult *outResult,char **acceptList,
                  int32_t acceptListCount,UEnumeration *availableLocales,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  void *buffer;
  char *pcVar5;
  size_t sVar6;
  char **fallbackList;
  char *l;
  char tmp [158];
  int local_50;
  int32_t maxLen;
  int32_t len;
  int32_t j;
  int32_t i;
  UEnumeration *availableLocales_local;
  int32_t acceptListCount_local;
  char **acceptList_local;
  UAcceptResult *outResult_local;
  int32_t resultAvailable_local;
  char *result_local;
  
  local_50 = 0;
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    buffer = uprv_malloc_63((long)acceptListCount << 3);
    if (buffer == (void *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      for (len = 0; len < acceptListCount; len = len + 1) {
        while (pcVar5 = uenum_next_63(availableLocales,(int32_t *)0x0,status), pcVar5 != (char *)0x0
              ) {
          sVar6 = strlen(pcVar5);
          iVar2 = (int)sVar6;
          iVar3 = strcmp(acceptList[len],pcVar5);
          if (iVar3 == 0) {
            if (outResult != (UAcceptResult *)0x0) {
              *outResult = ULOC_ACCEPT_VALID;
            }
            if (0 < iVar2) {
              iVar4 = uprv_min_63(iVar2,resultAvailable);
              strncpy(result,pcVar5,(long)iVar4);
            }
            for (maxLen = 0; maxLen < len; maxLen = maxLen + 1) {
              uprv_free_63(*(void **)((long)buffer + (long)maxLen * 8));
            }
            uprv_free_63(buffer);
            iVar4 = u_terminateChars_63(result,resultAvailable,iVar2,status);
            return iVar4;
          }
          if (local_50 < iVar2) {
            local_50 = iVar2;
          }
        }
        uenum_reset_63(availableLocales,status);
        iVar4 = uloc_getParent_63(acceptList[len],(char *)&l,0x9e,status);
        if (iVar4 == 0) {
          *(undefined8 *)((long)buffer + (long)len * 8) = 0;
        }
        else {
          pcVar5 = uprv_strdup_63((char *)&l);
          *(char **)((long)buffer + (long)len * 8) = pcVar5;
        }
      }
      while (local_50 = local_50 + -1, 0 < local_50) {
        for (len = 0; len < acceptListCount; len = len + 1) {
          if ((*(long *)((long)buffer + (long)len * 8) != 0) &&
             (sVar6 = strlen(*(char **)((long)buffer + (long)len * 8)), (int)sVar6 == local_50)) {
            while (pcVar5 = uenum_next_63(availableLocales,(int32_t *)0x0,status),
                  pcVar5 != (char *)0x0) {
              sVar6 = strlen(pcVar5);
              iVar2 = (int)sVar6;
              iVar3 = strcmp(*(char **)((long)buffer + (long)len * 8),pcVar5);
              if (iVar3 == 0) {
                if (outResult != (UAcceptResult *)0x0) {
                  *outResult = ULOC_ACCEPT_FALLBACK;
                }
                if (0 < iVar2) {
                  iVar4 = uprv_min_63(iVar2,resultAvailable);
                  strncpy(result,pcVar5,(long)iVar4);
                }
                for (maxLen = 0; maxLen < acceptListCount; maxLen = maxLen + 1) {
                  uprv_free_63(*(void **)((long)buffer + (long)maxLen * 8));
                }
                uprv_free_63(buffer);
                iVar4 = u_terminateChars_63(result,resultAvailable,iVar2,status);
                return iVar4;
              }
            }
            uenum_reset_63(availableLocales,status);
            iVar4 = uloc_getParent_63(*(char **)((long)buffer + (long)len * 8),(char *)&l,0x9e,
                                      status);
            if (iVar4 == 0) {
              uprv_free_63(*(void **)((long)buffer + (long)len * 8));
              *(undefined8 *)((long)buffer + (long)len * 8) = 0;
            }
            else {
              uprv_free_63(*(void **)((long)buffer + (long)len * 8));
              pcVar5 = uprv_strdup_63((char *)&l);
              *(char **)((long)buffer + (long)len * 8) = pcVar5;
            }
          }
        }
        if (outResult != (UAcceptResult *)0x0) {
          *outResult = ULOC_ACCEPT_FAILED;
        }
      }
      for (len = 0; len < acceptListCount; len = len + 1) {
        uprv_free_63(*(void **)((long)buffer + (long)len * 8));
      }
      uprv_free_63(buffer);
    }
  }
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_acceptLanguage(char *result, int32_t resultAvailable,
                    UAcceptResult *outResult, const char **acceptList,
                    int32_t acceptListCount,
                    UEnumeration* availableLocales,
                    UErrorCode *status)
{
    int32_t i,j;
    int32_t len;
    int32_t maxLen=0;
    char tmp[ULOC_FULLNAME_CAPACITY+1];
    const char *l;
    char **fallbackList;
    if(U_FAILURE(*status)) {
        return -1;
    }
    fallbackList = static_cast<char **>(uprv_malloc((size_t)(sizeof(fallbackList[0])*acceptListCount)));
    if(fallbackList==NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return -1;
    }
    for(i=0;i<acceptListCount;i++) {
#if defined(ULOC_DEBUG)
        fprintf(stderr,"%02d: %s\n", i, acceptList[i]);
#endif
        while((l=uenum_next(availableLocales, NULL, status)) != NULL) {
#if defined(ULOC_DEBUG)
            fprintf(stderr,"  %s\n", l);
#endif
            len = (int32_t)uprv_strlen(l);
            if(!uprv_strcmp(acceptList[i], l)) {
                if(outResult) {
                    *outResult = ULOC_ACCEPT_VALID;
                }
#if defined(ULOC_DEBUG)
                fprintf(stderr, "MATCH! %s\n", l);
#endif
                if(len>0) {
                    uprv_strncpy(result, l, uprv_min(len, resultAvailable));
                }
                for(j=0;j<i;j++) {
                    uprv_free(fallbackList[j]);
                }
                uprv_free(fallbackList);
                return u_terminateChars(result, resultAvailable, len, status);
            }
            if(len>maxLen) {
                maxLen = len;
            }
        }
        uenum_reset(availableLocales, status);
        /* save off parent info */
        if(uloc_getParent(acceptList[i], tmp, UPRV_LENGTHOF(tmp), status)!=0) {
            fallbackList[i] = uprv_strdup(tmp);
        } else {
            fallbackList[i]=0;
        }
    }

    for(maxLen--;maxLen>0;maxLen--) {
        for(i=0;i<acceptListCount;i++) {
            if(fallbackList[i] && ((int32_t)uprv_strlen(fallbackList[i])==maxLen)) {
#if defined(ULOC_DEBUG)
                fprintf(stderr,"Try: [%s]", fallbackList[i]);
#endif
                while((l=uenum_next(availableLocales, NULL, status)) != NULL) {
#if defined(ULOC_DEBUG)
                    fprintf(stderr,"  %s\n", l);
#endif
                    len = (int32_t)uprv_strlen(l);
                    if(!uprv_strcmp(fallbackList[i], l)) {
                        if(outResult) {
                            *outResult = ULOC_ACCEPT_FALLBACK;
                        }
#if defined(ULOC_DEBUG)
                        fprintf(stderr, "fallback MATCH! %s\n", l);
#endif
                        if(len>0) {
                            uprv_strncpy(result, l, uprv_min(len, resultAvailable));
                        }
                        for(j=0;j<acceptListCount;j++) {
                            uprv_free(fallbackList[j]);
                        }
                        uprv_free(fallbackList);
                        return u_terminateChars(result, resultAvailable, len, status);
                    }
                }
                uenum_reset(availableLocales, status);

                if(uloc_getParent(fallbackList[i], tmp, UPRV_LENGTHOF(tmp), status)!=0) {
                    uprv_free(fallbackList[i]);
                    fallbackList[i] = uprv_strdup(tmp);
                } else {
                    uprv_free(fallbackList[i]);
                    fallbackList[i]=0;
                }
            }
        }
        if(outResult) {
            *outResult = ULOC_ACCEPT_FAILED;
        }
    }
    for(i=0;i<acceptListCount;i++) {
        uprv_free(fallbackList[i]);
    }
    uprv_free(fallbackList);
    return -1;
}